

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_kvs_header_reset_all_stats(filemgr *file)

{
  pthread_spinlock_t *__lock;
  kvs_header *pkVar1;
  avl_node *node;
  avl_node *paVar2;
  
  pkVar1 = file->kv_header;
  __lock = &pkVar1->lock;
  pthread_spin_lock(__lock);
  node = avl_first(pkVar1->idx_id);
  while (node != (avl_node *)0x0) {
    paVar2 = avl_next(node);
    node[-4].right = (avl_node *)0x0;
    node[-3].parent = (avl_node *)0x0;
    node[-3].left = (avl_node *)0x0;
    node[-3].right = (avl_node *)0x0;
    node[-2].parent = (avl_node *)0x0;
    node[-2].left = (avl_node *)0x0;
    node[-2].right = (avl_node *)0x0;
    node = paVar2;
  }
  pthread_spin_unlock(__lock);
  return;
}

Assistant:

void fdb_kvs_header_reset_all_stats(struct filemgr *file)
{
    struct avl_node *a;
    struct kvs_node *node;
    struct kvs_header *kv_header = file->kv_header;

    spin_lock(&kv_header->lock);
    a = avl_first(kv_header->idx_id);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        a = avl_next(&node->avl_id);
        memset(&node->stat, 0x0, sizeof(node->stat));
    }
    spin_unlock(&kv_header->lock);
}